

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void GEO::CmdLine::ui_separator(string *title,string *short_title)

{
  size_type sVar1;
  size_type sVar2;
  bool bVar3;
  index_t iVar4;
  Logger *pLVar5;
  ostream *poVar6;
  ulong uVar7;
  char *pcVar8;
  size_t nb;
  string shortt;
  string local_50 [32];
  
  pLVar5 = Logger::instance();
  if (pLVar5->quiet_ != false) {
    return;
  }
  if (::(anonymous_namespace)::man_mode == '\x01') {
    bVar3 = std::operator==(title,"");
    if (bVar3) {
      return;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__cxx11::string::string((string *)&shortt,(string *)short_title);
    if ((shortt._M_string_length == 0) || (*shortt._M_dataplus._M_p != '*')) {
      poVar6 = std::operator<<((ostream *)&std::cout,(string *)title);
      poVar6 = std::operator<<(poVar6," (\"");
      poVar6 = std::operator<<(poVar6,(string *)&shortt);
      pcVar8 = ":*\" options)";
    }
    else {
      std::__cxx11::string::substr((ulong)local_50,(ulong)&shortt);
      std::__cxx11::string::operator=((string *)&shortt,local_50);
      std::__cxx11::string::~string(local_50);
      poVar6 = std::operator<<((ostream *)&std::cout,(string *)title);
      poVar6 = std::operator<<(poVar6," (\"");
      poVar6 = std::operator<<(poVar6,(string *)&shortt);
      pcVar8 = ":*\" options, advanced)";
    }
    poVar6 = std::operator<<(poVar6,pcVar8);
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  else {
    bVar3 = anon_unknown.dwarf_5db41::is_redirected();
    if (bVar3) {
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      bVar3 = std::operator!=(short_title,"");
      if ((bVar3) && (bVar3 = std::operator!=(title,""), bVar3)) {
        poVar6 = std::operator<<((ostream *)&std::cout,"=[");
        poVar6 = std::operator<<(poVar6,(string *)short_title);
        poVar6 = std::operator<<(poVar6,"]=[");
        poVar6 = std::operator<<(poVar6,(string *)title);
        poVar6 = std::operator<<(poVar6,"]=");
        std::endl<char,std::char_traits<char>>(poVar6);
        return;
      }
      std::operator+(&shortt,title,short_title);
      poVar6 = std::operator<<((ostream *)&std::cout,"=[");
      poVar6 = std::operator<<(poVar6,(string *)&shortt);
      poVar6 = std::operator<<(poVar6,"]=");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    else {
      anon_unknown.dwarf_5db41::update_ui_term_width();
      ::(anonymous_namespace)::ui_separator_opened = 1;
      sVar1 = title->_M_string_length;
      sVar2 = short_title->_M_string_length;
      std::operator<<((ostream *)&std::cout,"   ");
      anon_unknown.dwarf_5db41::ui_pad(' ',(ulong)::(anonymous_namespace)::ui_left_margin);
      anon_unknown.dwarf_5db41::ui_pad('_',sVar2 + sVar1 + 0xe);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      anon_unknown.dwarf_5db41::ui_pad(' ',(ulong)::(anonymous_namespace)::ui_left_margin);
      bVar3 = std::operator!=(short_title,"");
      if ((bVar3) && (bVar3 = std::operator!=(title,""), bVar3)) {
        poVar6 = std::operator<<((ostream *)&std::cout," _/ ==[");
        poVar6 = std::operator<<(poVar6,(string *)short_title);
        poVar6 = std::operator<<(poVar6,"]====[");
        poVar6 = std::operator<<(poVar6,(string *)title);
        std::operator<<(poVar6,"]== \\");
      }
      else {
        std::operator+(&shortt,title,short_title);
        poVar6 = std::operator<<((ostream *)&std::cout," _/ =====[");
        poVar6 = std::operator<<(poVar6,(string *)&shortt);
        std::operator<<(poVar6,"]===== \\");
        std::__cxx11::string::~string((string *)&shortt);
      }
      iVar4 = ui_terminal_width();
      uVar7 = (ulong)::(anonymous_namespace)::ui_left_margin + sVar2 + sVar1 +
              (ulong)::(anonymous_namespace)::ui_right_margin + 0x13;
      nb = 0;
      if (uVar7 <= iVar4) {
        nb = iVar4 - uVar7;
      }
      anon_unknown.dwarf_5db41::ui_pad('_',nb);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::__cxx11::string::string((string *)&shortt,"\n",(allocator *)local_50);
      ui_message(&shortt);
    }
  }
  std::__cxx11::string::~string((string *)&shortt);
  return;
}

Assistant:

void ui_separator(
            const std::string& title,
            const std::string& short_title
        ) {
            if(Logger::instance()->is_quiet()) {
                return;
            }

            if(man_mode) {
                if(title == "") {
                    return;
                }
                ui_out() << std::endl;
                std::string shortt = short_title;
                if(shortt.length() > 0 && shortt[0] == '*') {
                    shortt = shortt.substr(1, shortt.length()-1);
                    ui_out() << title << " (\"" << shortt << ":*\" options, advanced)"
                             << std::endl;
                } else {
                    ui_out() << title << " (\"" << shortt << ":*\" options)"
                             << std::endl;
                }
                ui_out() << std::endl << std::endl;                
                return;
            }
            
            if(is_redirected()) {
                ui_out() << std::endl;
                if(short_title != "" && title != "") {
                    ui_out() << "=[" << short_title << "]=["
                        << title << "]=" << std::endl;
                } else {
                    std::string s = title + short_title;
                    ui_out() << "=[" << s << "]=" << std::endl;
                }
                return;
            }

            update_ui_term_width();
            ui_separator_opened = true;

            size_t L = title.length() + short_title.length();

            ui_out() << "   ";
            ui_pad(' ', ui_left_margin);
            ui_pad('_', L + 14);
            ui_out() << std::endl;

            ui_pad(' ', ui_left_margin);
            if(short_title != "" && title != "") {
                ui_out() << " _/ ==[" << short_title << "]====["
                    << title << "]== \\";
            } else {
                std::string s = title + short_title;
                ui_out() << " _/ =====[" << s << "]===== \\";
            }

            ui_pad(
                '_',
                sub(
                    ui_terminal_width(),
                    19 + L + ui_left_margin + ui_right_margin
                )
            );
            ui_out() << std::endl;

            // Force a blank line under the separator
            ui_message("\n");
        }